

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O0

_Bool array_array_container_lazy_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  long lVar1;
  long lVar2;
  int iVar3;
  array_container_t *paVar4;
  size_t sVar5;
  bitset_container_t *pbVar6;
  array_container_t *in_RDX;
  uint16_t *in_RSI;
  int *in_RDI;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  uint64_t *words;
  undefined4 in_stack_ffffffffffffffd8;
  byte bVar7;
  _Bool local_1;
  
  iVar3 = *in_RDI + *(int *)in_RSI;
  in_RDX->cardinality = 0;
  in_RDX->capacity = 0;
  if (iVar3 < 0x401) {
    if (in_RDI[1] < iVar3) {
      paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
      *(array_container_t **)in_RDX = paVar4;
      lVar1._0_4_ = in_RDX->cardinality;
      lVar1._4_4_ = in_RDX->capacity;
      if (lVar1 == 0) {
        local_1 = true;
      }
      else {
        array_container_union
                  (in_RDX,(array_container_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                   in_stack_ffffffffffffffd0);
        local_1 = false;
      }
    }
    else {
      memmove((void *)(*(long *)(in_RDI + 2) + (long)*(int *)in_RSI * 2),*(void **)(in_RDI + 2),
              (long)*in_RDI << 1);
      sVar5 = fast_union_uint16(in_RSI,(size_t)in_RDX,
                                (uint16_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                                (size_t)in_stack_ffffffffffffffd0,
                                (uint16_t *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *in_RDI = (int)sVar5;
      local_1 = false;
    }
  }
  else {
    pbVar6 = bitset_container_create();
    *(bitset_container_t **)in_RDX = pbVar6;
    bVar7 = 1;
    lVar2._0_4_ = in_RDX->cardinality;
    lVar2._4_4_ = in_RDX->capacity;
    if (lVar2 != 0) {
      words = *(uint64_t **)in_RDX;
      bitset_set_list(words,(uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0x165368);
      bitset_set_list(words,(uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0x165387);
      *(undefined4 *)words = 0xffffffff;
    }
    local_1 = (_Bool)(bVar7 & 1);
  }
  return local_1;
}

Assistant:

bool array_array_container_lazy_inplace_union(array_container_t *src_1,
                                              const array_container_t *src_2,
                                              container_t **dst) {
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    //
    // We assume that operations involving bitset containers will be faster than
    // operations involving solely array containers, except maybe when array
    // containers are small. Indeed, for example, it is cheap to compute the
    // union between an array and a bitset container, generally more so than
    // between a large array and another array. So it is advantageous to favour
    // bitset containers during the computation. Of course, if we convert array
    // containers eagerly to bitset containers, we may later need to revert the
    // bitset containers to array containerr to satisfy the Roaring format
    // requirements, but such one-time conversions at the end may not be overly
    // expensive. We arrived to this design based on extensive benchmarking.
    //
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        if (src_1->capacity < totalCardinality) {
            *dst = array_container_create_given_capacity(
                2 * totalCardinality);  // be purposefully generous
            if (*dst != NULL) {
                array_container_union(src_1, src_2, CAST_array(*dst));
            } else {
                return true;  // otherwise failure won't be caught
            }
            return false;  // not a bitset
        } else {
            memmove(src_1->array + src_2->cardinality, src_1->array,
                    src_1->cardinality * sizeof(uint16_t));
            /*
              Next line is safe:

              We just need to focus on the reading and writing performed on
              array1. In `union_vector16`, both vectorized and scalar code still
              obey the basic rule: read from two inputs, do the union, and then
              write the output.

              Let's say the length(cardinality) of input2 is L2:
              ```
                  |<-  L2  ->|
              array1: [output--- |input 1---|---]
              array2: [input 2---]
              ```
              Let's define 3 __m128i pointers, `pos1` starts from `input1`,
              `pos2` starts from `input2`, these 2 point at the next byte to
              read, `out` starts from `output`, pointing at the next byte to
              overwrite.
              ```
              array1: [output--- |input 1---|---]
                          ^          ^
                      out        pos1
              array2: [input 2---]
                          ^
                          pos2
              ```
              The union output always contains less or equal number of elements
              than all inputs added, so we have:
              ```
              out <= pos1 + pos2
              ```
              therefore:
              ```
              out <= pos1 + L2
              ```
              which means you will not overwrite data beyond pos1, so the data
              haven't read is safe, and we don't care the data already read.
            */
            src_1->cardinality = (int32_t)fast_union_uint16(
                src_1->array + src_2->cardinality, src_1->cardinality,
                src_2->array, src_2->cardinality, src_1->array);
            return false;  // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        bitset_set_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}